

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_TxInTest_Test::TestBody(ConfidentialTransaction_TxInTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  char *rhs;
  AssertHelper local_b68;
  Message local_b60;
  int local_b58;
  uint local_b54;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_21;
  Message local_b38;
  AssertHelper local_b30;
  Message local_b28 [2];
  CfdException *anon_var_0_2;
  char *pcStack_b10;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_b00;
  uint32_t local_af4;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_20;
  Message local_ad8;
  uint32_t local_acc;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar_19;
  Message local_ab0;
  string local_aa8 [32];
  Txid local_a88;
  string local_a68 [32];
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_18;
  Message local_a30;
  uint local_a28;
  uint32_t local_a24;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar_17;
  Message local_a08;
  int local_a00;
  uint32_t local_9fc;
  undefined1 local_9f8 [8];
  AssertionResult gtest_ar_16;
  Message local_9e0;
  Txid local_9d8;
  string local_9b8 [32];
  undefined1 local_998 [8];
  AssertionResult gtest_ar_15;
  Message local_980;
  int local_974;
  size_type local_970;
  undefined1 local_968 [8];
  AssertionResult gtest_ar_14;
  Message local_950;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_948;
  undefined1 local_930 [8];
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ref_list;
  Message local_910;
  int local_904;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_13;
  Message local_8e8;
  AssertHelper local_8e0;
  Message local_8d8;
  int local_8d0;
  uint local_8cc;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_12;
  Message local_8b0;
  int local_8a4;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_11;
  Message local_888;
  int local_87c;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_10;
  Message local_860;
  AssertHelper local_858;
  Message local_850;
  AssertHelper local_848;
  Message local_840 [2];
  CfdException *anon_var_0_1;
  char *pcStack_828;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  uint32_t add_index;
  uint32_t index;
  Message local_810;
  ByteData local_808;
  string local_7f0 [32];
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_9;
  Message local_7b8;
  ByteData local_7b0;
  string local_798 [32];
  undefined1 local_778 [8];
  AssertionResult gtest_ar_8;
  Message local_760;
  ConfidentialValue local_758;
  string local_730 [32];
  undefined1 local_710 [8];
  AssertionResult gtest_ar_7;
  Message local_6f8;
  ConfidentialValue local_6f0;
  string local_6c8 [32];
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_6;
  Message local_690;
  ByteData256 local_688;
  string local_670 [32];
  undefined1 local_650 [8];
  AssertionResult gtest_ar_5;
  Message local_638;
  ByteData256 local_630;
  string local_618 [32];
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_4;
  Message local_5e0;
  uint local_5d8;
  uint32_t local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_3;
  Message local_5b8;
  int local_5b0;
  uint32_t local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_2;
  Message local_590;
  Txid local_588;
  string local_568 [32];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_1;
  Message local_530;
  ConfidentialTxInReference local_528;
  AssertHelper local_3c8;
  Message local_3c0 [2];
  CfdException *anon_var_0;
  byte local_249;
  char *pcStack_248;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ConfidentialTxInReference txin_ref;
  Message local_d8;
  int local_d0;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  Message local_b0 [2];
  ConfidentialTransaction local_a0 [80];
  undefined1 local_50 [8];
  ConfidentialTransaction tx;
  ConfidentialTransaction_TxInTest_Test *this_local;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::ConfidentialTransaction
                (local_a0,(string *)&exp_tx_hex_abi_cxx11_);
      cfd::core::ConfidentialTransaction::operator=((ConfidentialTransaction *)local_50,local_a0);
      cfd::core::ConfidentialTransaction::~ConfidentialTransaction(local_a0);
    }
  }
  else {
    testing::Message::Message(local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xa6,
               "Expected: (tx = ConfidentialTransaction(exp_tx_hex)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_b0);
  }
  local_cc = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_d0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_c8,"tx.GetTxInCount()","1",&local_cc,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdb8);
  if (bVar1) {
    local_249 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)&anon_var_0);
      cfd::core::ConfidentialTxInReference::operator=
                ((ConfidentialTxInReference *)&gtest_msg,(ConfidentialTxInReference *)&anon_var_0);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&anon_var_0);
    }
    if ((local_249 & 1) == 0) {
      pcStack_248 = 
      "Expected: (txin_ref = tx.GetTxIn(1)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0043484a;
    }
  }
  else {
LAB_0043484a:
    testing::Message::Message(local_3c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xaa,pcStack_248);
    testing::internal::AssertHelper::operator=(&local_3c8,local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message(local_3c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)&local_528);
      cfd::core::ConfidentialTxInReference::operator=
                ((ConfidentialTxInReference *)&gtest_msg,&local_528);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_528);
    }
  }
  else {
    testing::Message::Message(&local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xab,
               "Expected: (txin_ref = tx.GetTxIn(0)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_530);
  }
  cfd::core::AbstractTxInReference::GetTxid(&local_588,(AbstractTxInReference *)&gtest_msg);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_548,"txin_ref.GetTxid().GetHex().c_str()",
             "\"56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31\"",pcVar2,
             "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  std::__cxx11::string::~string(local_568);
  cfd::core::Txid::~Txid(&local_588);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_5ac = cfd::core::AbstractTxInReference::GetVout((AbstractTxInReference *)&gtest_msg);
  local_5b0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_5a8,"txin_ref.GetVout()","1",&local_5ac,&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  local_5d4 = cfd::core::AbstractTxInReference::GetSequence((AbstractTxInReference *)&gtest_msg);
  local_5d8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_5d0,"txin_ref.GetSequence()","0xffffffff",&local_5d4,
             &local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  cfd::core::ConfidentialTxInReference::GetBlindingNonce
            (&local_630,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5f8,"txin_ref.GetBlindingNonce().GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",pcVar2,
             "0000000000000000000000000000000000000000000000000000000000000000");
  std::__cxx11::string::~string(local_618);
  cfd::core::ByteData256::~ByteData256(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  cfd::core::ConfidentialTxInReference::GetAssetEntropy
            (&local_688,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_650,"txin_ref.GetAssetEntropy().GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",pcVar2,
             "0000000000000000000000000000000000000000000000000000000000000000");
  std::__cxx11::string::~string(local_670);
  cfd::core::ByteData256::~ByteData256(&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmount
            (&local_6f0,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6a8,"txin_ref.GetIssuanceAmount().GetHex().c_str()","\"\"",pcVar2,"")
  ;
  std::__cxx11::string::~string(local_6c8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  cfd::core::ConfidentialTxInReference::GetInflationKeys
            (&local_758,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_710,"txin_ref.GetInflationKeys().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_730);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmountRangeproof
            (&local_7b0,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_778,"txin_ref.GetIssuanceAmountRangeproof().GetHex().c_str()","\"\"",
             pcVar2,"");
  std::__cxx11::string::~string(local_798);
  cfd::core::ByteData::~ByteData(&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  cfd::core::ConfidentialTxInReference::GetInflationKeysRangeproof
            (&local_808,(ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7d0,"txin_ref.GetInflationKeysRangeproof().GetHex().c_str()","\"\"",
             pcVar2,"");
  std::__cxx11::string::~string(local_7f0);
  cfd::core::ByteData::~ByteData(&local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&add_index,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&add_index,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&add_index);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  gtest_msg_1.value._4_4_ = 0;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff7d8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff7d8);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_msg_1.value._4_4_ =
           cfd::core::ConfidentialTransaction::GetTxInIndex((Txid *)local_50,0x67c088);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_828 = 
      "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004359b3;
    }
  }
  else {
LAB_004359b3:
    testing::Message::Message(local_840);
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xbf,pcStack_828);
    testing::internal::AssertHelper::operator=(&local_848,local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    testing::Message::~Message(local_840);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_msg_1.value._0_4_ =
           cfd::core::ConfidentialTransaction::AddTxIn
                     ((Txid *)local_50,0x67c088,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message(&local_850);
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc2,
               "Expected: (add_index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_858,&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    testing::Message::~Message(&local_850);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_msg_1.value._4_4_ =
           cfd::core::ConfidentialTransaction::GetTxInIndex((Txid *)local_50,0x67c088);
    }
  }
  else {
    testing::Message::Message(&local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc3,
               "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_860);
  }
  local_87c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_878,"add_index","1",(uint *)&gtest_msg_1,&local_87c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  local_8a4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_8a0,"index","1",(uint *)((long)&gtest_msg_1.value + 4),
             &local_8a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  local_8cc = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_8d0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_8c8,"tx.GetTxInCount()","2",&local_8cc,&local_8d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_msg_1.value._4_4_ =
           cfd::core::ConfidentialTransaction::GetTxInIndex((Txid *)local_50,0x67c088);
    }
  }
  else {
    testing::Message::Message(&local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,200,
               "Expected: (index = tx.GetTxInIndex(exp_txid, exp_index | 0x80000000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_8e8);
  }
  local_904 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_900,"index","1",(uint *)((long)&gtest_msg_1.value + 4),
             &local_904);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &ref_list.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &ref_list.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_910);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &ref_list.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
            *)local_930);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxInList();
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::operator=((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                   *)local_930,&local_948);
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::~vector(&local_948);
    }
  }
  else {
    testing::Message::Message(&local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xcd,
               "Expected: (ref_list = tx.GetTxInList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_950);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_950);
  }
  local_970 = std::
              vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
              ::size((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                      *)local_930);
  local_974 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_968,"ref_list.size()","2",&local_970,&local_974);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_968);
  if (!bVar1) {
    testing::Message::Message(&local_980);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_968);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_980);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_980);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_968);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,0);
  cfd::core::AbstractTxInReference::GetTxid(&local_9d8,&pvVar3->super_AbstractTxInReference);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_998,"ref_list[0].GetTxid().GetHex().c_str()",
             "\"56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31\"",pcVar2,
             "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  std::__cxx11::string::~string(local_9b8);
  cfd::core::Txid::~Txid(&local_9d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
  if (!bVar1) {
    testing::Message::Message(&local_9e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,0);
  local_9fc = cfd::core::AbstractTxInReference::GetVout(&pvVar3->super_AbstractTxInReference);
  local_a00 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_9f8,"ref_list[0].GetVout()","1",&local_9fc,&local_a00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
  if (!bVar1) {
    testing::Message::Message(&local_a08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_a08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,0);
  local_a24 = cfd::core::AbstractTxInReference::GetSequence(&pvVar3->super_AbstractTxInReference);
  local_a28 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_a20,"ref_list[0].GetSequence()","0xffffffff",&local_a24,
             &local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar1) {
    testing::Message::Message(&local_a30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_a30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,1);
  cfd::core::AbstractTxInReference::GetTxid(&local_a88,&pvVar3->super_AbstractTxInReference);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a48,"ref_list[1].GetTxid().GetHex().c_str()",
             "exp_txid.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string(local_aa8);
  std::__cxx11::string::~string(local_a68);
  cfd::core::Txid::~Txid(&local_a88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar1) {
    testing::Message::Message(&local_ab0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,1);
  local_acc = cfd::core::AbstractTxInReference::GetVout(&pvVar3->super_AbstractTxInReference);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_ac8,"ref_list[1].GetVout()","exp_index",&local_acc,&exp_index)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
  if (!bVar1) {
    testing::Message::Message(&local_ad8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
  pvVar3 = std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)local_930,1);
  local_af4 = cfd::core::AbstractTxInReference::GetSequence(&pvVar3->super_AbstractTxInReference);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_af0,"ref_list[1].GetSequence()","exp_sequence",&local_af4,
             &exp_sequence);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff4f0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff4f0);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::RemoveTxIn((uint)local_50);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_0043703d;
    pcStack_b10 = 
    "Expected: (tx.RemoveTxIn(5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_b28);
  testing::internal::AssertHelper::AssertHelper
            (&local_b30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0xda,pcStack_b10);
  testing::internal::AssertHelper::operator=(&local_b30,local_b28);
  testing::internal::AssertHelper::~AssertHelper(&local_b30);
  testing::Message::~Message(local_b28);
LAB_0043703d:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::RemoveTxIn((uint)local_50);
    }
  }
  else {
    testing::Message::Message(&local_b38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xdb,
               "Expected: (tx.RemoveTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_b38);
  }
  local_b54 = cfd::core::ConfidentialTransaction::GetTxInCount();
  local_b58 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_b50,"tx.GetTxInCount()","1",&local_b54,&local_b58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
    testing::internal::AssertHelper::~AssertHelper(&local_b68);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)local_930);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_msg);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxInTest) {
  ConfidentialTransaction tx(2, static_cast<uint32_t>(0));
  EXPECT_NO_THROW((tx = ConfidentialTransaction(exp_tx_hex)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  // GetTxIn
  ConfidentialTxInReference txin_ref;
  EXPECT_THROW((txin_ref = tx.GetTxIn(1)), CfdException);
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(0)));
  EXPECT_STREQ(
      txin_ref.GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(txin_ref.GetVout(), 1);
  EXPECT_EQ(txin_ref.GetSequence(), 0xffffffff);
  EXPECT_STREQ(
      txin_ref.GetBlindingNonce().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(
      txin_ref.GetAssetEntropy().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(txin_ref.GetIssuanceAmount().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeys().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetIssuanceAmountRangeproof().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeysRangeproof().GetHex().c_str(), "");

  // GetTxInIndex, AddTxIn
  uint32_t index = 0;
  uint32_t add_index;
  EXPECT_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)), CfdException);

  EXPECT_NO_THROW(
      (add_index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)));
  EXPECT_EQ(add_index, 1);
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxInCount(), 2);
  // mask check
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index | 0x80000000)));
  EXPECT_EQ(index, 1);

  // GetTxInList
  std::vector<ConfidentialTxInReference> ref_list;
  EXPECT_NO_THROW((ref_list = tx.GetTxInList()));
  EXPECT_EQ(ref_list.size(), 2);
  EXPECT_STREQ(
      ref_list[0].GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(ref_list[0].GetVout(), 1);
  EXPECT_EQ(ref_list[0].GetSequence(), 0xffffffff);
  EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(),
               exp_txid.GetHex().c_str());
  EXPECT_EQ(ref_list[1].GetVout(), exp_index);
  EXPECT_EQ(ref_list[1].GetSequence(), exp_sequence);

  // RemoveTxIn
  EXPECT_THROW((tx.RemoveTxIn(5)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxIn(1)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
}